

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi_load_from_callbacks
                    (stbi_io_callbacks *clbk,void *user,int *x,int *y,int *comp,int req_comp)

{
  uchar *puVar1;
  undefined1 local_118 [8];
  stbi__context s;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  void *user_local;
  stbi_io_callbacks *clbk_local;
  
  s.img_buffer_original_end._4_4_ = req_comp;
  stbi__start_callbacks((stbi__context *)local_118,clbk,user);
  puVar1 = stbi__load_and_postprocess_8bit
                     ((stbi__context *)local_118,x,y,comp,s.img_buffer_original_end._4_4_);
  return puVar1;
}

Assistant:

STBIDEF stbi_uc *stbi_load_from_callbacks(stbi_io_callbacks const *clbk, void *user, int *x, int *y, int *comp, int req_comp)
{
   stbi__context s;
   stbi__start_callbacks(&s, (stbi_io_callbacks *) clbk, user);
   return stbi__load_and_postprocess_8bit(&s,x,y,comp,req_comp);
}